

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# engine.cpp
# Opt level: O1

int polyscope::sizeInBytes(TextureFormat *f)

{
  int iVar1;
  
  iVar1 = -1;
  if ((ulong)*f < 10) {
    iVar1 = *(int *)(&DAT_0033c778 + (ulong)*f * 4);
  }
  return iVar1;
}

Assistant:

int sizeInBytes(const TextureFormat& f) {
  // clang-format off
  switch (f) {
    case TextureFormat::RGB8:     return 3*1;
    case TextureFormat::RGBA8:    return 4*1;
    case TextureFormat::RG16F:    return 2*2;
    case TextureFormat::RGB16F:   return 3*2;
    case TextureFormat::RGBA16F:  return 4*2;
    case TextureFormat::R32F:     return 1*4;
    case TextureFormat::R16F:     return 1*2;
    case TextureFormat::RGB32F:   return 3*4;
    case TextureFormat::RGBA32F:  return 4*4;
    case TextureFormat::DEPTH24:  return 1*3;
  }
  // clang-format on
  return -1;
}